

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::MapFieldGenerator
          (MapFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  bool local_2d;
  Options *options_local;
  FieldDescriptor *descriptor_local;
  MapFieldGenerator *this_local;
  
  FieldGenerator::FieldGenerator(&this->super_FieldGenerator,options);
  (this->super_FieldGenerator)._vptr_FieldGenerator = (_func_int **)&PTR__MapFieldGenerator_006f5288
  ;
  this->descriptor_ = descriptor;
  local_2d = false;
  if ((options->proto_h & 1U) != 0) {
    local_2d = IsFieldDependent(descriptor);
  }
  this->dependent_field_ = local_2d;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  SetMessageVariables(descriptor,&this->variables_,options);
  return;
}

Assistant:

MapFieldGenerator::MapFieldGenerator(const FieldDescriptor* descriptor,
                                     const Options& options)
    : FieldGenerator(options),
      descriptor_(descriptor),
      dependent_field_(options.proto_h && IsFieldDependent(descriptor)) {
  SetMessageVariables(descriptor, &variables_, options);
}